

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
qt_custom_file_engine_handler_create(QString *path)

{
  QAbstractFileEngineHandler **ppQVar1;
  long lVar2;
  long *plVar3;
  Type *pTVar4;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *this;
  long lVar5;
  
  if ((__atomic_base<int>)qt_file_engine_handlers_in_use._q_value.super___atomic_base<int>._M_i !=
      (__atomic_base<int>)0x0) {
    this = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
            *)path;
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>::
    operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
                *)path);
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             ::operator()(this);
    ppQVar1 = (pTVar4->super_QList<QAbstractFileEngineHandler_*>).d.ptr;
    lVar2 = (pTVar4->super_QList<QAbstractFileEngineHandler_*>).d.size;
    for (lVar5 = 0; lVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
      plVar3 = *(long **)((long)ppQVar1 + lVar5);
      (path->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*plVar3 + 0x10))(path);
      if ((path->d).d != (Data *)0x0) {
        return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
                )(__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
                  )path;
      }
      std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::~unique_ptr
                ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)path)
      ;
    }
  }
  (path->d).d = (Data *)0x0;
  return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
         )(__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
           )path;
}

Assistant:

std::unique_ptr<QAbstractFileEngine> qt_custom_file_engine_handler_create(const QString &path)
{
    if (qt_file_engine_handlers_in_use.loadRelaxed()) {
        QReadLocker locker(fileEngineHandlerMutex());

        // check for registered handlers that can load the file
        for (QAbstractFileEngineHandler *handler : std::as_const(*fileEngineHandlers())) {
            if (auto engine = handler->create(path))
                return engine;
        }
    }

    return nullptr;
}